

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

void mpc_input_unmark(mpc_input_t *i)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  mpc_state_t *pmVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (0 < i->backtrack) {
    iVar1 = i->marks_num;
    uVar3 = iVar1 - 1;
    i->marks_num = uVar3;
    if ((0x20 < i->marks_slots) &&
       (((iVar1 - ((int)uVar3 >> 0x1f)) + -1 >> 1) + iVar1 + -1 < i->marks_slots)) {
      uVar7 = 0x20;
      if (0x21 < iVar1) {
        uVar7 = (ulong)uVar3;
      }
      i->marks_slots = (int)uVar7;
      pmVar4 = (mpc_state_t *)realloc(i->marks,uVar7 << 5);
      i->marks = pmVar4;
      pcVar5 = (char *)realloc(i->lasts,(long)i->marks_slots);
      i->lasts = pcVar5;
    }
    if ((i->type == 2) && (i->marks_num == 0)) {
      sVar6 = strlen(i->buffer);
      uVar3 = (int)sVar6 - 1;
      if (-1 < (int)uVar3) {
        lVar8 = (ulong)uVar3 + 1;
        do {
          ungetc((int)i->buffer[lVar8 + -1],(FILE *)i->file);
          lVar9 = lVar8 + -1;
          bVar2 = 0 < lVar8;
          lVar8 = lVar9;
        } while (lVar9 != 0 && bVar2);
      }
      free(i->buffer);
      i->buffer = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void mpc_input_unmark(mpc_input_t *i) {
  int j;

  if (i->backtrack < 1) { return; }

  i->marks_num--;

  if (i->marks_slots > i->marks_num + i->marks_num / 2
  &&  i->marks_slots > MPC_INPUT_MARKS_MIN) {
    i->marks_slots =
      i->marks_num > MPC_INPUT_MARKS_MIN ?
      i->marks_num : MPC_INPUT_MARKS_MIN;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 0) {
    for (j = strlen(i->buffer) - 1; j >= 0; j--)
      ungetc(i->buffer[j], i->file);

    free(i->buffer);
    i->buffer = NULL;
  }

}